

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O1

void __thiscall libDAI::FactorGraph::ReadFromFile(FactorGraph *this,char *filename)

{
  char cVar1;
  Exception *this_00;
  ifstream infile;
  string local_248;
  istream local_228 [520];
  
  std::ifstream::ifstream(local_228);
  std::ifstream::open((char *)local_228,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    operator>>(local_228,this);
    std::ifstream::close();
    std::ifstream::~ifstream(local_228);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"factorgraph.cpp, line 294","");
  Exception::Exception(this_00,5,&local_248);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FactorGraph::ReadFromFile( const char *filename ) {
        ifstream infile;
        infile.open( filename );
        if( infile.is_open() ) {
            try { // FIXME: no exceptions are generated by iostreams by default
                infile >> *this;
                infile.close();
            } catch (...) {
                infile.close();
                throw;
            }
        } else
            DAI_THROW(CANNOT_READ_FILE);
    }